

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cc
# Opt level: O0

ZeroCopyInputStream * __thiscall
google::protobuf::compiler::DiskSourceTree::OpenDiskFile(DiskSourceTree *this,string_view filename)

{
  char *pcVar1;
  int *piVar2;
  FileInputStream *this_00;
  bool bVar3;
  FileInputStream *result;
  string local_118 [32];
  int local_f8;
  int file_descriptor;
  allocator<char> local_e1;
  string local_e0 [36];
  int local_bc;
  undefined1 local_b8 [4];
  int ret;
  stat sb;
  DiskSourceTree *this_local;
  string_view filename_local;
  
  filename_local._M_len = (size_t)filename._M_str;
  this_local = (DiskSourceTree *)filename._M_len;
  local_bc = 0;
  sb.__glibc_reserved[2] = (__syscall_slong_t)this;
  do {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              (local_e0,(basic_string_view<char,_std::char_traits<char>_> *)&this_local,&local_e1);
    pcVar1 = (char *)std::__cxx11::string::c_str();
    local_bc = stat(pcVar1,(stat *)local_b8);
    std::__cxx11::string::~string(local_e0);
    std::allocator<char>::~allocator(&local_e1);
    bVar3 = false;
    if (local_bc != 0) {
      piVar2 = __errno_location();
      bVar3 = *piVar2 == 4;
    }
  } while (bVar3);
  if ((local_bc == 0) && (((uint)sb.st_nlink & 0xf000) == 0x4000)) {
    std::__cxx11::string::operator=
              ((string *)&this->last_error_message_,"Input file is a directory.");
    filename_local._M_str = (char *)0x0;
  }
  else {
    do {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                (local_118,(basic_string_view<char,_std::char_traits<char>_> *)&this_local,
                 (allocator<char> *)((long)&result + 7));
      pcVar1 = (char *)std::__cxx11::string::c_str();
      local_f8 = open(pcVar1,0);
      std::__cxx11::string::~string(local_118);
      std::allocator<char>::~allocator((allocator<char> *)((long)&result + 7));
      bVar3 = false;
      if (local_f8 < 0) {
        piVar2 = __errno_location();
        bVar3 = *piVar2 == 4;
      }
    } while (bVar3);
    if (local_f8 < 0) {
      filename_local._M_str = (char *)0x0;
    }
    else {
      this_00 = (FileInputStream *)operator_new(0x58);
      io::FileInputStream::FileInputStream(this_00,local_f8,-1);
      io::FileInputStream::SetCloseOnDelete(this_00,true);
      filename_local._M_str = (char *)this_00;
    }
  }
  return (ZeroCopyInputStream *)filename_local._M_str;
}

Assistant:

io::ZeroCopyInputStream* DiskSourceTree::OpenDiskFile(
    absl::string_view filename) {
  struct stat sb;
  int ret = 0;
  do {
    ret = stat(std::string(filename).c_str(), &sb);
  } while (ret != 0 && errno == EINTR);
#if defined(_WIN32)
  if (ret == 0 && sb.st_mode & S_IFDIR) {
    last_error_message_ = "Input file is a directory.";
    return nullptr;
  }
#else
  if (ret == 0 && S_ISDIR(sb.st_mode)) {
    last_error_message_ = "Input file is a directory.";
    return nullptr;
  }
#endif
  int file_descriptor;
  do {
    file_descriptor = open(std::string(filename).c_str(), O_RDONLY);
  } while (file_descriptor < 0 && errno == EINTR);
  if (file_descriptor >= 0) {
    io::FileInputStream* result = new io::FileInputStream(file_descriptor);
    result->SetCloseOnDelete(true);
    return result;
  } else {
    return nullptr;
  }
}